

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O0

void DCT(Block *block)

{
  int iVar1;
  double dVar2;
  double local_1a0;
  double local_178;
  uint local_15c;
  double dStack_158;
  uint n_1;
  double sum_1;
  uint k_1;
  int *f_1;
  uint i_1;
  uint n;
  double sum;
  uint k;
  int *f;
  int local_118;
  uint i;
  Block temp;
  Block *block_local;
  
  memcpy(&local_118,block,0x100);
  for (f._4_4_ = 0; f._4_4_ < 8; f._4_4_ = f._4_4_ + 1) {
    for (sum._4_4_ = 0; sum._4_4_ < 8; sum._4_4_ = sum._4_4_ + 1) {
      _i_1 = 0.0;
      for (f_1._4_4_ = 0; f_1._4_4_ < 8; f_1._4_4_ = f_1._4_4_ + 1) {
        iVar1 = (&local_118)[(ulong)(f._4_4_ << 3) + (ulong)f_1._4_4_];
        dVar2 = cos((((double)f_1._4_4_ + 0.5) * 3.141592653589793 * (double)sum._4_4_) / 8.0);
        _i_1 = (double)iVar1 * dVar2 + _i_1;
      }
      if (sum._4_4_ == 0) {
        local_178 = sqrt(0.125);
      }
      else {
        local_178 = sqrt(0.25);
      }
      local_178 = _i_1 * local_178;
      (*block)[f._4_4_ * 8 + sum._4_4_] = (int)local_178;
    }
  }
  memcpy(&local_118,block,0x100);
  for (f_1._0_4_ = 0; (uint)f_1 < 8; f_1._0_4_ = (uint)f_1 + 1) {
    for (sum_1._4_4_ = 0; sum_1._4_4_ < 8; sum_1._4_4_ = sum_1._4_4_ + 1) {
      dStack_158 = 0.0;
      for (local_15c = 0; local_15c < 8; local_15c = local_15c + 1) {
        iVar1 = (&local_118)[(ulong)(uint)f_1 + (ulong)(local_15c << 3)];
        dVar2 = cos((((double)local_15c + 0.5) * 3.141592653589793 * (double)sum_1._4_4_) / 8.0);
        dStack_158 = (double)iVar1 * dVar2 + dStack_158;
      }
      if (sum_1._4_4_ == 0) {
        local_1a0 = sqrt(0.125);
      }
      else {
        local_1a0 = sqrt(0.25);
      }
      local_1a0 = dStack_158 * local_1a0;
      (*block)[(uint)f_1 + sum_1._4_4_ * 8] = (int)local_1a0;
    }
  }
  return;
}

Assistant:

void DCT(Block& block) {
    Block temp;
    std::memcpy(&temp, &block, sizeof(Block)); //copy from original
    //8 rows
    //DCT行变化
    for(uint i = 0; i < 8; i++) {
        int* f = &temp[i * 8]; //one dimension Array , and will perform DCT on it
        for(uint k = 0; k < 8; k++) {
            double sum = 0.0;
            for(uint n = 0; n < 8; n++){
                sum = sum + f[n] * std::cos(((n + 0.5) * M_PI * k / 8));
            }
            sum = (k == 0) ? (sum * std::sqrt(1.0 / 8)) : (sum * std::sqrt(2.0 / 8));
            block[i * 8 + k] = sum;
        }
    }
    
    std::memcpy(&temp, &block, sizeof(Block)); //copy from 
    //DCT列变化
    for(uint i = 0; i < 8; i++) {
        int* f = &temp[i]; //one dimension Array with 8 steps increment , and will perform DCT on it
        for(uint k = 0; k < 8; k++) {
            double sum = 0.0;
            for(uint n = 0; n < 8; n++){
                sum = sum + f[n * 8] * std::cos(((n + 0.5) * M_PI * k / 8));
            }
            sum = (k == 0) ? (sum * std::sqrt(1.0 / 8)) : (sum * std::sqrt(2.0 / 8));
            block[i + k * 8] = sum;
        }
    }
}